

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O3

void Saig_ManBmcSectionsTest(Aig_Man_t *p)

{
  int iVar1;
  void *__ptr;
  Vec_Vec_t *__ptr_00;
  ulong uVar2;
  void **ppvVar3;
  ulong uVar4;
  
  __ptr_00 = Saig_ManBmcSections(p);
  iVar1 = __ptr_00->nSize;
  uVar2 = (ulong)iVar1;
  if ((long)uVar2 < 1) {
    Abc_Print((int)p,"\n");
LAB_0056756b:
    ppvVar3 = __ptr_00->pArray;
    if (ppvVar3 == (void **)0x0) goto LAB_0056757c;
  }
  else {
    ppvVar3 = __ptr_00->pArray;
    uVar4 = 0;
    do {
      Abc_Print((int)p,"%d=%d ",uVar4 & 0xffffffff,(ulong)*(uint *)((long)ppvVar3[uVar4] + 4));
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
    Abc_Print((int)p,"\n");
    if (iVar1 < 1) goto LAB_0056756b;
    ppvVar3 = __ptr_00->pArray;
    uVar4 = 0;
    do {
      __ptr = ppvVar3[uVar4];
      if (__ptr != (void *)0x0) {
        if (*(void **)((long)__ptr + 8) != (void *)0x0) {
          free(*(void **)((long)__ptr + 8));
        }
        free(__ptr);
      }
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  free(ppvVar3);
LAB_0056757c:
  free(__ptr_00);
  return;
}

Assistant:

void Saig_ManBmcSectionsTest( Aig_Man_t * p )
{
    Vec_Vec_t * vSects;
    Vec_Ptr_t * vOne;
    int i;
    vSects = Saig_ManBmcSections( p );
    Vec_VecForEachLevel( vSects, vOne, i )
        Abc_Print( 1, "%d=%d ", i, Vec_PtrSize(vOne) );
    Abc_Print( 1, "\n" );
    Vec_VecFree( vSects );
}